

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O1

void pelelm_mgvort(Box *bx,FArrayBox *derfab,int dcomp,int param_4,FArrayBox *datfab,
                  Geometry *geomdata,Real param_7,int *param_8,int param_9)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  double *pdVar16;
  double *pdVar17;
  EBCellFlagFab *this;
  EBCellFlag *pEVar18;
  double dVar19;
  double dVar20;
  int iVar21;
  int iVar22;
  FabType FVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  void *__s;
  int iVar50;
  bool bVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  int local_1b8;
  
  dVar19 = (geomdata->super_CoordSys).inv_dx[0];
  dVar20 = (geomdata->super_CoordSys).inv_dx[1];
  dVar2 = (geomdata->super_CoordSys).inv_dx[2];
  uVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  uVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  uVar5 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar25 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - uVar3) + 1);
  lVar35 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - uVar4) + 1);
  lVar36 = lVar35 * lVar25;
  lVar26 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - uVar5) + 1);
  lVar37 = lVar36 * lVar26;
  pdVar16 = (derfab->super_BaseFab<double>).dptr;
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar7 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar46 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar27 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
  lVar38 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
  lVar39 = lVar38 * lVar27;
  lVar47 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar46) + 1);
  lVar48 = lVar47 * dcomp;
  pdVar17 = (datfab->super_BaseFab<double>).dptr;
  this = (EBCellFlagFab *)datfab[1].super_BaseFab<double>._vptr_BaseFab;
  FVar23 = amrex::EBCellFlagFab::getType(this,bx);
  if (FVar23 == singlevalued) {
    iVar8 = (bx->smallend).vect[2];
    iVar9 = (bx->bigend).vect[2];
    if (iVar8 <= iVar9) {
      pEVar18 = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
      iVar10 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      iVar11 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      iVar12 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      iVar13 = (this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
      lVar26 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar10) + 1)
      ;
      iVar50 = (bx->smallend).vect[0];
      iVar1 = (bx->smallend).vect[1];
      iVar14 = (bx->bigend).vect[0];
      iVar22 = (bx->bigend).vect[1];
      iVar44 = -uVar3;
      do {
        if (iVar1 <= iVar22) {
          iVar34 = iVar8 - uVar5;
          lVar47 = lVar36 * iVar34;
          lVar35 = (iVar34 + 1) * lVar36;
          lVar38 = (int)(~uVar5 + iVar8) * lVar36;
          iVar21 = iVar1;
          do {
            if (iVar50 <= iVar14) {
              iVar24 = iVar21 - uVar4;
              lVar40 = iVar24 * lVar25;
              lVar41 = (iVar24 + 1) * lVar25;
              lVar28 = (int)(~uVar4 + iVar21) * lVar25;
              iVar49 = iVar50;
              do {
                uVar15 = pEVar18[((long)iVar8 - (long)iVar12) * ((iVar13 - iVar11) + 1) * lVar26 +
                                 (iVar21 - iVar11) * lVar26 + (long)(iVar49 - iVar10)].flag;
                dVar52 = 0.0;
                if ((~uVar15 & 3) != 0) {
                  if ((uVar15 >> 0x13 & 1) == 0) {
                    lVar29 = (long)(int)(~uVar3 + iVar49);
                    lVar42 = (long)(int)((-2 - uVar3) + iVar49);
                    dVar52 = -(pdVar17[lVar40 + lVar47 + lVar42 + lVar37] * -0.5 +
                              pdVar17[lVar40 + lVar47 + (iVar44 + iVar49) + lVar37] * -1.5 +
                              pdVar17[lVar40 + lVar47 + lVar29 + lVar37] +
                              pdVar17[lVar40 + lVar47 + lVar29 + lVar37]);
                    dVar53 = -(pdVar17[lVar40 + lVar47 + lVar42 + lVar37 * 2] * -0.5 +
                              pdVar17[lVar40 + lVar47 + (long)(iVar44 + iVar49) + lVar37 * 2] * -1.5
                              + pdVar17[lVar40 + lVar47 + lVar29 + lVar37 * 2] +
                                pdVar17[lVar40 + lVar47 + lVar29 + lVar37 * 2]);
                  }
                  else if ((uVar15 >> 0x11 & 1) == 0) {
                    lVar29 = (long)(iVar44 + iVar49 + 1);
                    lVar42 = (long)(iVar44 + 2 + iVar49);
                    dVar52 = pdVar17[lVar40 + lVar47 + lVar42 + lVar37] * -0.5 +
                             pdVar17[lVar40 + lVar47 + (iVar44 + iVar49) + lVar37] * -1.5 +
                             pdVar17[lVar40 + lVar47 + lVar29 + lVar37] +
                             pdVar17[lVar40 + lVar47 + lVar29 + lVar37];
                    dVar53 = pdVar17[lVar40 + lVar47 + lVar42 + lVar37 * 2] * -0.5 +
                             pdVar17[lVar40 + lVar47 + (long)(iVar44 + iVar49) + lVar37 * 2] * -1.5
                             + pdVar17[lVar40 + lVar47 + lVar29 + lVar37 * 2] +
                               pdVar17[lVar40 + lVar47 + lVar29 + lVar37 * 2];
                  }
                  else {
                    lVar29 = (long)(iVar44 + iVar49 + 1);
                    lVar42 = (long)(int)(~uVar3 + iVar49);
                    dVar52 = (pdVar17[lVar40 + lVar47 + lVar29 + lVar37] -
                             pdVar17[lVar40 + lVar47 + lVar42 + lVar37]) * 0.5;
                    dVar53 = (pdVar17[lVar40 + lVar47 + lVar29 + lVar37 * 2] -
                             pdVar17[lVar40 + lVar47 + lVar42 + lVar37 * 2]) * 0.5;
                  }
                  lVar29 = (long)(iVar44 + iVar49);
                  if ((uVar15 >> 0x15 & 1) == 0) {
                    dVar54 = pdVar17[lVar47 + lVar28 + lVar29];
                    dVar55 = (pdVar17 + lVar47 + lVar28 + lVar29)[lVar37 * 2];
                    dVar54 = -(pdVar17[lVar47 + (iVar24 + -2) * lVar25 + lVar29] * -0.5 +
                              pdVar17[lVar47 + lVar40 + lVar29] * -1.5 + dVar54 + dVar54);
                    dVar55 = -((pdVar17 + lVar47 + (iVar24 + -2) * lVar25 + lVar29)[lVar37 * 2] *
                               -0.5 + (pdVar17 + lVar47 + lVar40 + lVar29)[lVar37 * 2] * -1.5 +
                                      dVar55 + dVar55);
                  }
                  else if ((short)uVar15 < 0) {
                    dVar54 = (pdVar17[lVar47 + lVar41 + lVar29] - pdVar17[lVar47 + lVar28 + lVar29])
                             * 0.5;
                    dVar55 = ((pdVar17 + lVar47 + lVar41 + lVar29)[lVar37 * 2] -
                             (pdVar17 + lVar47 + lVar28 + lVar29)[lVar37 * 2]) * 0.5;
                  }
                  else {
                    dVar54 = pdVar17[lVar47 + lVar41 + lVar29];
                    dVar55 = (pdVar17 + lVar47 + lVar41 + lVar29)[lVar37 * 2];
                    dVar54 = pdVar17[lVar47 + (iVar24 + 2) * lVar25 + lVar29] * -0.5 +
                             pdVar17[lVar47 + lVar40 + lVar29] * -1.5 + dVar54 + dVar54;
                    dVar55 = (pdVar17 + lVar47 + (iVar24 + 2) * lVar25 + lVar29)[lVar37 * 2] * -0.5
                             + (pdVar17 + lVar47 + lVar40 + lVar29)[lVar37 * 2] * -1.5 +
                               dVar55 + dVar55;
                  }
                  if ((uVar15 >> 0x1b & 1) == 0) {
                    lVar29 = (long)(iVar44 + iVar49);
                    dVar56 = pdVar17[lVar40 + lVar29 + lVar38];
                    dVar57 = (pdVar17 + lVar40 + lVar29 + lVar38)[lVar37];
                    dVar56 = -(pdVar17[lVar40 + lVar29 + (iVar34 + -2) * lVar36] * -0.5 +
                              pdVar17[lVar40 + lVar29 + lVar47] * -1.5 + dVar56 + dVar56);
                    dVar57 = -((pdVar17 + lVar40 + lVar29 + (iVar34 + -2) * lVar36)[lVar37] * -0.5 +
                              (pdVar17 + lVar40 + lVar29 + lVar47)[lVar37] * -1.5 + dVar57 + dVar57)
                    ;
                  }
                  else {
                    lVar29 = (long)(iVar44 + iVar49);
                    if ((uVar15 >> 9 & 1) == 0) {
                      dVar56 = pdVar17[lVar40 + lVar29 + lVar35];
                      dVar57 = (pdVar17 + lVar40 + lVar29 + lVar35)[lVar37];
                      dVar56 = pdVar17[lVar40 + lVar29 + (iVar34 + 2) * lVar36] * -0.5 +
                               pdVar17[lVar40 + lVar29 + lVar47] * -1.5 + dVar56 + dVar56;
                      dVar57 = (pdVar17 + lVar40 + lVar29 + (iVar34 + 2) * lVar36)[lVar37] * -0.5 +
                               pdVar17[lVar40 + lVar29 + lVar47 + lVar37] * -1.5 + dVar57 + dVar57;
                    }
                    else {
                      dVar56 = (pdVar17[lVar40 + lVar29 + lVar35] -
                               pdVar17[lVar40 + lVar29 + lVar38]) * 0.5;
                      dVar57 = (pdVar17[lVar40 + lVar29 + lVar35 + lVar37] -
                               (pdVar17 + lVar40 + lVar29 + lVar38)[lVar37]) * 0.5;
                    }
                  }
                  dVar52 = dVar19 * dVar52 - dVar54 * dVar20;
                  dVar53 = dVar2 * dVar56 - dVar53 * dVar19;
                  dVar54 = dVar20 * dVar55 - dVar57 * dVar2;
                  dVar52 = dVar52 * dVar52 + dVar54 * dVar54 + dVar53 * dVar53;
                  if (dVar52 < 0.0) {
                    dVar52 = sqrt(dVar52);
                  }
                  else {
                    dVar52 = SQRT(dVar52);
                  }
                }
                pdVar16[lVar48 * lVar39 +
                        (iVar8 - iVar46) * lVar39 +
                        (iVar21 - iVar7) * lVar27 + (long)(iVar49 - iVar6)] = dVar52;
                iVar49 = iVar49 + 1;
              } while (iVar14 + 1 != iVar49);
            }
            bVar51 = iVar21 != iVar22;
            iVar21 = iVar21 + 1;
          } while (bVar51);
        }
        bVar51 = iVar8 != iVar9;
        iVar8 = iVar8 + 1;
      } while (bVar51);
    }
  }
  else if (FVar23 == covered) {
    iVar8 = (bx->smallend).vect[2];
    iVar9 = (bx->bigend).vect[2];
    if (iVar8 <= iVar9) {
      iVar10 = (bx->bigend).vect[0];
      iVar11 = (bx->bigend).vect[1];
      iVar12 = (bx->smallend).vect[1];
      iVar13 = (bx->smallend).vect[0];
      iVar46 = iVar8 - iVar46;
      do {
        if (iVar12 <= iVar11) {
          __s = (void *)((long)pdVar16 +
                        (iVar46 * lVar39 + (long)iVar13) * 8 +
                        ((long)iVar12 * 8 + dcomp * lVar38 * lVar47 * 8 + (long)iVar7 * -8) * lVar27
                        + (long)iVar6 * -8);
          iVar50 = (iVar11 - iVar12) + 1;
          do {
            if (iVar13 <= iVar10) {
              memset(__s,0,(ulong)(uint)(iVar10 - iVar13) * 8 + 8);
            }
            __s = (void *)((long)__s + lVar27 * 8);
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar46 = iVar46 + 1;
        bVar51 = iVar8 != iVar9;
        iVar8 = iVar8 + 1;
      } while (bVar51);
    }
  }
  else {
    iVar8 = (bx->smallend).vect[2];
    iVar9 = (bx->bigend).vect[2];
    if (iVar8 <= iVar9) {
      iVar10 = (bx->smallend).vect[1];
      iVar11 = (bx->smallend).vect[0];
      iVar12 = (bx->bigend).vect[1];
      iVar13 = (bx->bigend).vect[0];
      lVar40 = (long)iVar11 * 8;
      lVar41 = lVar40 + (long)(int)uVar3 * -8;
      lVar47 = (long)(int)uVar4 * -8;
      iVar50 = iVar8 - uVar5;
      local_1b8 = iVar50 + -1;
      lVar39 = lVar35 * 8;
      do {
        iVar50 = iVar50 + 1;
        if (iVar10 <= iVar12) {
          lVar28 = (long)iVar8;
          lVar42 = (lVar28 - (int)uVar5) * lVar39;
          lVar43 = (lVar26 * 0x10 + (long)(int)uVar5 * -8 + lVar28 * 8) * lVar35;
          lVar29 = (int)(iVar8 - uVar5) * lVar36;
          iVar14 = iVar10;
          iVar1 = ~uVar4 + iVar10;
          iVar22 = iVar10 - uVar4;
          do {
            iVar22 = iVar22 + 1;
            if (iVar11 <= iVar13) {
              lVar30 = (long)iVar14;
              lVar31 = (int)(iVar14 - uVar4) * lVar25;
              lVar45 = 0;
              do {
                lVar32 = (long)(int)((iVar11 - uVar3) + (int)lVar45 + 1);
                lVar33 = (long)(int)((iVar11 - uVar3) + -1 + (int)lVar45);
                dVar54 = (*(double *)
                           ((long)pdVar17 +
                           lVar45 * 8 + (lVar43 + (long)iVar22 * 8) * lVar25 + lVar41) -
                         *(double *)
                          ((long)pdVar17 + lVar45 * 8 + (lVar43 + (long)iVar1 * 8) * lVar25 + lVar41
                          )) * 0.5 * dVar20 -
                         (*(double *)
                           ((long)pdVar17 +
                           lVar45 * 8 +
                           ((lVar26 * 8 + (long)iVar50 * 8) * lVar35 + lVar47 + lVar30 * 8) * lVar25
                           + lVar41) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar45 * 8 +
                          ((lVar26 * 8 + (long)local_1b8 * 8) * lVar35 + lVar47 + lVar30 * 8) *
                          lVar25 + lVar41)) * 0.5 * dVar2;
                dVar53 = (*(double *)
                           ((long)pdVar17 +
                           lVar45 * 8 + (iVar50 * lVar39 + lVar47 + lVar30 * 8) * lVar25 + lVar41) -
                         *(double *)
                          ((long)pdVar17 +
                          lVar45 * 8 + (local_1b8 * lVar39 + lVar47 + lVar30 * 8) * lVar25 + lVar41)
                         ) * 0.5 * dVar2 -
                         (pdVar17[lVar31 + lVar29 + lVar32 + lVar37 * 2] -
                         pdVar17[lVar31 + lVar29 + lVar33 + lVar37 * 2]) * 0.5 * dVar19;
                dVar52 = (pdVar17[lVar31 + lVar29 + lVar32 + lVar37] -
                         pdVar17[lVar31 + lVar29 + lVar33 + lVar37]) * 0.5 * dVar19 -
                         (*(double *)
                           ((long)pdVar17 +
                           lVar45 * 8 + (lVar42 + (long)iVar22 * 8) * lVar25 + lVar41) -
                         *(double *)
                          ((long)pdVar17 + lVar45 * 8 + (lVar42 + (long)iVar1 * 8) * lVar25 + lVar41
                          )) * 0.5 * dVar20;
                dVar52 = dVar52 * dVar52 + dVar54 * dVar54 + dVar53 * dVar53;
                if (dVar52 < 0.0) {
                  dVar52 = sqrt(dVar52);
                }
                else {
                  dVar52 = SQRT(dVar52);
                }
                *(double *)
                 ((long)pdVar16 +
                 lVar45 * 8 +
                 ((lVar48 * 8 + (long)iVar46 * -8 + lVar28 * 8) * lVar38 + (long)iVar7 * -8 +
                 lVar30 * 8) * lVar27 + lVar40 + (long)iVar6 * -8) = dVar52;
                lVar45 = lVar45 + 1;
              } while (((long)iVar13 - (long)iVar11) + 1 != lVar45);
            }
            iVar1 = iVar1 + 1;
            bVar51 = iVar14 != iVar12;
            iVar14 = iVar14 + 1;
          } while (bVar51);
        }
        local_1b8 = local_1b8 + 1;
        bVar51 = iVar8 != iVar9;
        iVar8 = iVar8 + 1;
      } while (bVar51);
    }
  }
  return;
}

Assistant:

void pelelm_mgvort (const Box& bx, FArrayBox& derfab, int dcomp, int /*ncomp*/,
                    const FArrayBox& datfab, const Geometry& geomdata,
                    Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));

    AMREX_D_TERM(const amrex::Real idx = geomdata.InvCellSize(0);,
                 const amrex::Real idy = geomdata.InvCellSize(1);,
                 const amrex::Real idz = geomdata.InvCellSize(2););

    amrex::Array4<amrex::Real const> const& dat_arr = datfab.const_array();
    amrex::Array4<amrex::Real>       const&vort_arr = derfab.array(dcomp);

#ifdef AMREX_USE_EB
    const EBFArrayBox& ebfab = static_cast<EBFArrayBox const&>(datfab);
    const EBCellFlagFab& flags = ebfab.getEBCellFlagFab();
    auto typ = flags.getType(bx);
    if (typ == FabType::covered)
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            vort_arr(i,j,k) = 0.0;
        });
    } else if (typ == FabType::singlevalued)
    {
       const auto& flag_fab = flags.const_array();
       amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          constexpr amrex::Real c0 = -1.5;
          constexpr amrex::Real c1 = 2.0;
          constexpr amrex::Real c2 = -0.5;
          if (flag_fab(i,j,k).isCovered()) {
             vort_arr(i,j,k) = 0.0;
          } else {
             amrex::Real vx = 0.0;
             amrex::Real uy = 0.0;
#if ( AMREX_SPACEDIM == 2 )
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
             } else {
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected( 0,1,0)) {
                uy = - (c0 * dat_arr(i,j  ,k,0)
                      + c1 * dat_arr(i,j-1,k,0)
                      + c2 * dat_arr(i,j-2,k,0)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                uy = (c0 * dat_arr(i,j  ,k,0)
                    + c1 * dat_arr(i,j+1,k,0)
                    + c2 * dat_arr(i,j+2,k,0)) * idy;
             } else {
                uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
             }
             vort_arr(i,j,k) = vx-uy;
#elif ( AMREX_SPACEDIM == 3 )
             amrex::Real wx = 0.0;
             amrex::Real wy = 0.0;
             amrex::Real uz = 0.0;
             amrex::Real vz = 0.0;
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                // Covered cell to the right, go fish left
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
                wx = - (c0 * dat_arr(i  ,j,k,2)
                      + c1 * dat_arr(i-1,j,k,2)
                      + c2 * dat_arr(i-2,j,k,2)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                // Covered cell to the left, go fish right
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
                wx = (c0 * dat_arr(i  ,j,k,2)
                    + c1 * dat_arr(i+1,j,k,2)
                    + c2 * dat_arr(i+2,j,k,2)) * idx;
             } else {
                // No covered cells right or left, use standard stencil
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
                wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected(0, 1,0)) {
                 uy = - (c0 * dat_arr(i,j  ,k,0)
                       + c1 * dat_arr(i,j-1,k,0)
                       + c2 * dat_arr(i,j-2,k,0)) * idy;
                 wy = - (c0 * dat_arr(i,j  ,k,2)
                       + c1 * dat_arr(i,j-1,k,2)
                       + c2 * dat_arr(i,j-2,k,2)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                 uy = (c0 * dat_arr(i,j  ,k,0)
                     + c1 * dat_arr(i,j+1,k,0)
                     + c2 * dat_arr(i,j+2,k,0)) * idy;
                 wy = (c0 * dat_arr(i,j  ,k,2)
                     + c1 * dat_arr(i,j+1,k,2)
                     + c2 * dat_arr(i,j+2,k,2)) * idy;
             } else {
                 uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
                 wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;
             }
             // Do the same in z-direction
             if (!flag_fab(i,j,k).isConnected(0,0, 1)) {
                 uz = - (c0 * dat_arr(i,j,k  ,0)
                       + c1 * dat_arr(i,j,k-1,0)
                       + c2 * dat_arr(i,j,k-2,0)) * idz;
                 vz = - (c0 * dat_arr(i,j,k  ,1)
                       + c1 * dat_arr(i,j,k-1,1)
                       + c2 * dat_arr(i,j,k-2,1)) * idz;
             } else if (!flag_fab(i,j,k).isConnected(0,0,-1)) {
                 uz = (c0 * dat_arr(i,j,k  ,0)
                     + c1 * dat_arr(i,j,k+1,0)
                     + c2 * dat_arr(i,j,k+2,0)) * idz;
                 vz = (c0 * dat_arr(i,j,k  ,1)
                     + c1 * dat_arr(i,j,k+1,1)
                     + c2 * dat_arr(i,j,k+2,1)) * idz;
             } else {
                 uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
                 vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;
             }
             vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
          }
       });
    } else
#endif
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
#if ( AMREX_SPACEDIM == 2 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            vort_arr(i,j,k) = vx-uy;

#elif ( AMREX_SPACEDIM == 3 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;

            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            amrex::Real wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;

            amrex::Real uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
            amrex::Real vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;

            vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
        });
    }
}